

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *context)

{
  byte *pbVar1;
  short sVar2;
  _Bool _Var3;
  wchar_t wVar4;
  monster_conflict *pmVar5;
  short sVar6;
  int iVar7;
  char *fmt;
  char m_name [80];
  char m_poss [80];
  
  if ((context->origin).what == SRC_MONSTER) {
    wVar4 = (context->origin).which.grid.x;
    if (L'\0' < wVar4) {
      pmVar5 = (monster_conflict *)cave_monster(cave,wVar4);
      if (pmVar5 != (monster_conflict *)0x0) {
        wVar4 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
        pmVar5 = choose_nearby_injured_kin((chunk *)cave,pmVar5);
        if (pmVar5 != (monster_conflict *)0x0) {
          monster_desc(m_name,0x50,(monster *)pmVar5,L'̔');
          monster_desc(m_poss,0x50,(monster *)pmVar5,L'\"');
          if (player->timed[2] == 0) {
            _Var3 = monster_is_visible((monster *)pmVar5);
          }
          else {
            _Var3 = false;
          }
          iVar7 = wVar4 + pmVar5->hp;
          sVar2 = pmVar5->maxhp;
          sVar6 = (short)iVar7;
          if (sVar2 < iVar7) {
            sVar6 = sVar2;
          }
          pmVar5->hp = sVar6;
          if (_Var3 != false) {
            fmt = "%s looks healthier.";
            if (sVar6 == sVar2) {
              fmt = "%s looks REALLY healthy!";
            }
            msg(fmt,m_name);
          }
          if ((monster_conflict *)player->upkeep->health_who == pmVar5) {
            pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
            *pbVar1 = *pbVar1 | 2;
          }
          if (pmVar5->m_timed[3] != 0) {
            mon_clear_timed((monster *)pmVar5,L'\x03',L'\x04');
            msg("%s recovers %s courage.",m_name,m_poss);
          }
          context->ident = true;
        }
      }
    }
    return true;
  }
  __assert_fail("context->origin.what == SRC_MONSTER",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-attack.c"
                ,0x146,"_Bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *context)
{
	assert(context->origin.what == SRC_MONSTER);

	int midx = context->origin.which.monster;
	struct monster *mon = midx > 0 ? cave_monster(cave, midx) : NULL;
	if (!mon) return true;

	int amount = effect_calculate_value(context, false);
	char m_name[80], m_poss[80];
	bool seen;

	/* Find a nearby monster */
	mon = choose_nearby_injured_kin(cave, mon);
	if (!mon) return true;

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the monster possessive ("his"/"her"/"its") */
	monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

	seen = (!player->timed[TMD_BLIND] && monster_is_visible(mon));

	/* Heal some */
	mon->hp = MIN(mon->hp + amount, mon->maxhp);

	if (seen) {
		if (mon->hp == mon->maxhp) {
			msg("%s looks REALLY healthy!", m_name);
		} else if (seen) { /* Partially healed */
			msg("%s looks healthier.", m_name);
		}
	}

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Cancel fear */
	if (mon->m_timed[MON_TMD_FEAR]) {
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		msg("%s recovers %s courage.", m_name, m_poss);
	}

	/* ID */
	context->ident = true;

	return true;
}